

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O0

char * google::ProgramInvocationShortName(void)

{
  long lVar1;
  long lVar2;
  undefined8 local_18;
  size_t pos;
  
  lVar1 = std::__cxx11::string::rfind(-0x68,0x2f);
  if (lVar1 == -1) {
    local_18 = (char *)std::__cxx11::string::c_str();
  }
  else {
    lVar2 = std::__cxx11::string::c_str();
    local_18 = (char *)(lVar2 + lVar1 + 1);
  }
  return local_18;
}

Assistant:

const char* ProgramInvocationShortName() {        // like the GNU libc fn
  size_t pos = argv0.rfind('/');
#ifdef OS_WINDOWS
  if (pos == string::npos) pos = argv0.rfind('\\');
#endif
  return (pos == string::npos ? argv0.c_str() : (argv0.c_str() + pos + 1));
}